

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.cpp
# Opt level: O2

bool vera::loadSTL(string *_filename,Mesh *_mesh)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  FILE *__stream;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  size_t sVar10;
  Mesh *__new_size;
  allocator local_3212;
  allocator local_3211;
  Mesh *local_3210;
  vec3 local_3208;
  double nd [3];
  vec3 local_31d8;
  double vd [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31a8;
  char solid [80];
  Triangle tri_1;
  char header [80];
  char buf [4];
  uint num_tri;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> triangles;
  char header_1 [80];
  unsigned_short att_count;
  vec3 n;
  
  __stream = fopen((_filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    bVar8 = 0;
    fprintf(_stderr,"IOError: %s could not be opened...\n",(_filename->_M_dataplus)._M_p);
    goto LAB_002a6447;
  }
  solid[0x40] = '\0';
  solid[0x41] = '\0';
  solid[0x42] = '\0';
  solid[0x43] = '\0';
  solid[0x44] = '\0';
  solid[0x45] = '\0';
  solid[0x46] = '\0';
  solid[0x47] = '\0';
  solid[0x48] = '\0';
  solid[0x49] = '\0';
  solid[0x4a] = '\0';
  solid[0x4b] = '\0';
  solid[0x4c] = '\0';
  solid[0x4d] = '\0';
  solid[0x4e] = '\0';
  solid[0x4f] = '\0';
  solid[0x30] = '\0';
  solid[0x31] = '\0';
  solid[0x32] = '\0';
  solid[0x33] = '\0';
  solid[0x34] = '\0';
  solid[0x35] = '\0';
  solid[0x36] = '\0';
  solid[0x37] = '\0';
  solid[0x38] = '\0';
  solid[0x39] = '\0';
  solid[0x3a] = '\0';
  solid[0x3b] = '\0';
  solid[0x3c] = '\0';
  solid[0x3d] = '\0';
  solid[0x3e] = '\0';
  solid[0x3f] = '\0';
  solid[0x20] = '\0';
  solid[0x21] = '\0';
  solid[0x22] = '\0';
  solid[0x23] = '\0';
  solid[0x24] = '\0';
  solid[0x25] = '\0';
  solid[0x26] = '\0';
  solid[0x27] = '\0';
  solid[0x28] = '\0';
  solid[0x29] = '\0';
  solid[0x2a] = '\0';
  solid[0x2b] = '\0';
  solid[0x2c] = '\0';
  solid[0x2d] = '\0';
  solid[0x2e] = '\0';
  solid[0x2f] = '\0';
  solid[0x10] = '\0';
  solid[0x11] = '\0';
  solid[0x12] = '\0';
  solid[0x13] = '\0';
  solid[0x14] = '\0';
  solid[0x15] = '\0';
  solid[0x16] = '\0';
  solid[0x17] = '\0';
  solid[0x18] = '\0';
  solid[0x19] = '\0';
  solid[0x1a] = '\0';
  solid[0x1b] = '\0';
  solid[0x1c] = '\0';
  solid[0x1d] = '\0';
  solid[0x1e] = '\0';
  solid[0x1f] = '\0';
  solid[0] = '\0';
  solid[1] = '\0';
  solid[2] = '\0';
  solid[3] = '\0';
  solid[4] = '\0';
  solid[5] = '\0';
  solid[6] = '\0';
  solid[7] = '\0';
  solid[8] = '\0';
  solid[9] = '\0';
  solid[10] = '\0';
  solid[0xb] = '\0';
  solid[0xc] = '\0';
  solid[0xd] = '\0';
  solid[0xe] = '\0';
  solid[0xf] = '\0';
  sVar4 = fread(header,1,0x50,__stream);
  if (sVar4 != 0x50) {
    pcVar9 = "IOError: too short (1).";
    goto LAB_002a642e;
  }
  __isoc99_sscanf(header,"%79s",solid);
  std::__cxx11::string::string((string *)buf,"solid",(allocator *)header_1);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                          solid);
  std::__cxx11::string::~string((string *)buf);
  if (bVar1) {
LAB_002a5da8:
    fseek(__stream,0,0);
    sVar4 = fread(header_1,1,0x50,__stream);
    if (sVar4 == 0x50) {
      sVar4 = fread(&num_tri,4,1,__stream);
      if (sVar4 != 1) {
        pcVar9 = "IOError: bad format (7).";
        goto LAB_002a642e;
      }
      triangles.super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      triangles.super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      triangles.super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (Mesh *)(ulong)num_tri;
      std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::resize
                (&triangles,(size_type)__new_size);
      iVar7 = 0;
      if ((int)num_tri < 1) {
        __new_size = (Mesh *)0x0;
      }
      bVar8 = 3;
      local_3210 = __new_size;
      do {
        if (iVar7 == (int)local_3210) {
          std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(&triangles);
          goto LAB_002a641b;
        }
        Triangle::Triangle((Triangle *)buf);
        sVar4 = fread(&n,4,3,__stream);
        if (sVar4 == 3) {
          Triangle::setNormals((Triangle *)buf,&n,&n,&n);
          for (sVar10 = 0; sVar10 != 3; sVar10 = sVar10 + 1) {
            sVar4 = fread((vec3 *)&att_count,4,3,__stream);
            if (sVar4 != 3) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (9).");
              std::endl<char,std::char_traits<char>>(poVar5);
              bVar1 = true;
              goto LAB_002a5f34;
            }
            Triangle::setVertex((Triangle *)buf,sVar10,(vec3 *)&att_count);
          }
          sVar4 = fread((vec3 *)&att_count,2,1,__stream);
          bVar1 = false;
          if (sVar4 != 1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (10).");
            std::endl<char,std::char_traits<char>>(poVar5);
            bVar1 = true;
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (8).");
          std::endl<char,std::char_traits<char>>(poVar5);
          bVar1 = true;
        }
LAB_002a5f34:
        Triangle::~Triangle((Triangle *)buf);
        iVar7 = iVar7 + 1;
      } while (!bVar1);
      std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(&triangles);
      if (!bVar1) goto LAB_002a6447;
    }
    else {
      pcVar9 = "IOError: bad format (6).";
LAB_002a642e:
      poVar5 = std::operator<<((ostream *)&std::cerr,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
LAB_002a643b:
    bVar8 = 0;
  }
  else {
    sVar4 = fread(buf,1,4,__stream);
    if (sVar4 != 4) {
      pcVar9 = "IOError: too short (3).";
      goto LAB_002a642e;
    }
    fseek(__stream,0,2);
    lVar6 = ftell(__stream);
    if ((long)(int)lVar6 == (ulong)(uint)buf * 0x32 + 0x54) goto LAB_002a5da8;
    fseek(__stream,0,0);
    pcVar9 = fgets(buf,0x800,__stream);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "IOError: ascii too short (2).";
      goto LAB_002a642e;
    }
    local_3210 = _mesh;
LAB_002a6027:
    Triangle::Triangle(&tri_1);
    iVar7 = __isoc99_fscanf(__stream,"%s %s %lg %lg %lg",header_1,&triangles,nd,nd + 1,nd + 2);
    local_3208.field_1.y = (float)nd[1];
    local_3208.field_0.x = (float)nd[0];
    local_3208.field_2.z = (float)nd[2];
    std::__cxx11::string::string((string *)&n,"endsolid",(allocator *)&att_count);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                            header_1);
    std::__cxx11::string::~string((string *)&n);
    if (!bVar1) {
      if (iVar7 == 5) {
        std::__cxx11::string::string((string *)&n,"facet",(allocator *)&num_tri);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&n,header_1);
        if (bVar1) {
LAB_002a611b:
          std::__cxx11::string::string((string *)&att_count,"normal",(allocator *)vd);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&att_count,(char *)&triangles);
          std::__cxx11::string::~string((string *)&att_count);
          if (!bVar1) goto LAB_002a6155;
        }
        else {
          std::__cxx11::string::string((string *)&local_31a8,"faced",&local_3211);
          bVar2 = std::operator==(&local_31a8,header_1);
          bVar3 = true;
          if (bVar2) goto LAB_002a611b;
LAB_002a6155:
          std::__cxx11::string::~string((string *)&local_31a8);
        }
        std::__cxx11::string::~string((string *)&n);
        if (bVar3 != false) goto LAB_002a649f;
        local_3208.field_1.y = (float)nd[1];
        local_3208.field_0.x = (float)nd[0];
        local_3208.field_2.z = (float)nd[2];
        Triangle::setNormals(&tri_1,&local_3208,&local_3208,&local_3208);
        iVar7 = __isoc99_fscanf(__stream,"%s %s",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&n,&att_count);
        if (iVar7 == 2) {
          std::__cxx11::string::string((string *)&num_tri,"outer",(allocator *)&local_31d8);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&num_tri,(char *)&n);
          if (bVar1) {
            std::__cxx11::string::~string((string *)&num_tri);
          }
          else {
            std::__cxx11::string::string((string *)vd,"loop",&local_3212);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)vd,(char *)&att_count);
            std::__cxx11::string::~string((string *)vd);
            std::__cxx11::string::~string((string *)&num_tri);
            if (!bVar1) {
              sVar10 = 0;
              do {
                iVar7 = __isoc99_fscanf(__stream,"%s",&num_tri);
                if (iVar7 != 1) {
LAB_002a645f:
                  poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (4).");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  goto LAB_002a654c;
                }
                std::__cxx11::string::string((string *)vd,"endloop",(allocator *)&local_31d8);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)vd,(char *)&num_tri);
                std::__cxx11::string::~string((string *)vd);
                if (bVar1) goto LAB_002a632d;
                std::__cxx11::string::string((string *)vd,"vertex",(allocator *)&local_31d8);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)vd,(char *)&num_tri);
                std::__cxx11::string::~string((string *)vd);
                if (!bVar1) goto LAB_002a645f;
                iVar7 = __isoc99_fscanf(__stream,"%lg %lg %lg",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)vd,vd + 1,vd + 2);
                if (iVar7 != 3) {
                  poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (3).");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  goto LAB_002a654c;
                }
                local_31d8.field_1.y = (float)vd[1];
                local_31d8.field_0.x = (float)vd[0];
                local_31d8.field_2.z = (float)vd[2];
                Triangle::setVertex(&tri_1,sVar10,&local_31d8);
                sVar10 = sVar10 + 1;
              } while( true );
            }
          }
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (2). ");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
LAB_002a649f:
        poVar5 = std::operator<<((ostream *)&std::cout,"facet: ");
        poVar5 = std::operator<<(poVar5,header_1);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"normal: ");
        poVar5 = std::operator<<(poVar5,(char *)&triangles);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (1).");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      goto LAB_002a654c;
    }
    Triangle::~Triangle(&tri_1);
LAB_002a641b:
    bVar8 = 1;
  }
  fclose(__stream);
LAB_002a6447:
  return (bool)(bVar8 & 1);
LAB_002a632d:
  Mesh::addTriangle(local_3210,&tri_1);
  iVar7 = __isoc99_fscanf(__stream,"%s",&num_tri);
  if (iVar7 == 1) {
    std::__cxx11::string::string((string *)vd,"endfacet",(allocator *)&local_31d8);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vd,
                            (char *)&num_tri);
    std::__cxx11::string::~string((string *)vd);
    if (!bVar1) {
      Triangle::~Triangle(&tri_1);
      goto LAB_002a6027;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (5).");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_002a654c:
  Triangle::~Triangle(&tri_1);
  goto LAB_002a643b;
}

Assistant:

bool loadSTL( const std::string& _filename, Mesh& _mesh ) {
    FILE * stl_file = fopen(_filename.c_str(),"rb");
    if (NULL == stl_file) {
        fprintf(stderr,"IOError: %s could not be opened...\n", _filename.c_str());
        return false;
    }

     // Specifically 80 character header
    char header[80];
    char solid[80] = {0};
    bool is_ascii = true;
    if (fread(header, 1, 80, stl_file) != 80) {
        std::cerr << "IOError: too short (1)." << std::endl;
        goto close_false;
    }
    sscanf(header, "%79s", solid);
  
    if ( std::string("solid") != solid) 
        is_ascii = false;
    else {
        // might still be binary
        char buf[4];
        if ( fread(buf, 1, 4, stl_file) != 4) {
            std::cerr << "IOError: too short (3)." << std::endl;
            goto close_false;
        }
    
        size_t num_faces = *reinterpret_cast<unsigned int*>(buf);
        fseek(stl_file,0,SEEK_END);
        int file_size = ftell(stl_file);
        if (file_size == 80 + 4 + (4*12 + 2) * num_faces) is_ascii = false;
        else is_ascii = true;
    }

    if (is_ascii) {
        // Rewind to end of header
        //stl_file = fopen(filename.c_str(),"r");
        //stl_file = freopen(NULL,"r",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        if (NULL == stl_file) {
            fprintf(stderr,"IOError: stl file could not be reopened as ascii ...\n");
            return false;
        }
        // Read 80 header
        // Eat file name

        char name[LINE_MAX];
        if ( NULL == fgets(name, LINE_MAX, stl_file)) {
            std::cerr << "IOError: ascii too short (2)." << std::endl;
            goto close_false;
        }

        // ascii
        while(true) {
            int ret;
            char facet[LINE_MAX];
            char normal[LINE_MAX];

            Triangle tri;
            glm::vec3 n;

            double nd[3];
            ret = fscanf(stl_file,"%s %s %lg %lg %lg", facet, normal, nd, nd+1, nd+2);
            n.x = nd[0];
            n.y = nd[1];
            n.z = nd[2];

            if (std::string("endsolid") == facet)
                break;
            
            if (ret != 5 || 
                !(  std::string("facet") == facet || 
                    std::string("faced") == facet) ||
                    std::string("normal") != normal) {
                std::cout << "facet: " << facet << std::endl;
                std::cout << "normal: " <<normal << std::endl;
                std::cerr << "IOError: bad format (1)." << std::endl;
                goto close_false;
            }
            // copy casts to Type
            n.x = nd[0]; 
            n.y = nd[1];
            n.z = nd[2];
            tri.setNormals(n, n, n);
            char outer[LINE_MAX], loop[LINE_MAX];
            ret = fscanf(stl_file,"%s %s",outer,loop);
            if (ret != 2 || std::string("outer") != outer || std::string("loop") != loop) {
                std::cerr << "IOError: bad format (2). " << std::endl;
                goto close_false;
            }
            
            size_t index = 0;
            while(true) {
                char word[LINE_MAX];
                int ret = fscanf(stl_file, "%s", word);
                if (ret == 1 && std::string("endloop") == word)
                    break;
                else if (ret == 1 && std::string("vertex") == word) {
                    glm::vec3 v;
                    double vd[3];
                    int ret = fscanf(stl_file, "%lg %lg %lg", vd, vd+1, vd+2);
                    if (ret != 3) {
                        std::cerr << "IOError: bad format (3)." << std::endl;
                        goto close_false;
                    }
                    tri.setVertex(index, glm::vec3(vd[0], vd[1], vd[2]));
                    index++;
                }
                else {
                    std::cerr << "IOError: bad format (4)." << std::endl;
                    goto close_false;
                }
            }
            _mesh.addTriangle(tri);

            char endfacet[LINE_MAX];
            ret = fscanf(stl_file,"%s",endfacet);
            if (ret != 1 || std::string("endfacet") != endfacet) {
                std::cerr << "IOError: bad format (5)." << std::endl;
                goto close_false;
            }
        }
        // read endfacet
        goto close_true;
    }
    else {
        // Binary
        // stl_file = freopen(NULL,"rb",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        // Read 80 header
        char header[80];
        if (fread(header, sizeof(char), 80, stl_file) != 80) {
            std::cerr << "IOError: bad format (6)." << std::endl;
            goto close_false;
        }
        // Read number of triangles
        unsigned int num_tri;
        if (fread(&num_tri, sizeof(unsigned int), 1, stl_file) != 1) {
            std::cerr << "IOError: bad format (7)." << std::endl;
            goto close_false;
        }

        std::vector<Triangle> triangles;
        triangles.resize(num_tri);
        for(int t = 0; t < (int)num_tri; t++) {
            Triangle tri;

            // Read normal
            glm::vec3 n;
            if (fread(&n.x, sizeof(float), 3, stl_file) != 3) {
                std::cerr << "IOError: bad format (8)." << std::endl;
                goto close_false;
            }
            tri.setNormals(n, n, n);

            // Read each vertex
            for (size_t c = 0; c < 3; c++) {
                glm::vec3 v;
                if (fread (&v.x, sizeof(float), 3, stl_file) != 3) {
                    std::cerr << "IOError: bad format (9)." << std::endl;
                    goto close_false;
                }
                tri.setVertex(c, v);
            }
            
            // Read attribute size
            unsigned short att_count;
            if (fread(&att_count, sizeof(unsigned short), 1, stl_file) != 1) {
                std::cerr << "IOError: bad format (10)." << std::endl;
                goto close_false;
            }
        }
        goto close_true;
    }

    close_false:
        fclose(stl_file);
        return false;
    close_true:
        fclose(stl_file);
        return true;
}